

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-perm.c
# Opt level: O2

int borg_perma_aux(int what)

{
  borg_grid *pbVar1;
  borg_spells bVar2;
  _Bool _Var3;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  undefined1 auVar11 [16];
  
  iVar7 = 0;
  iVar8 = 0;
  switch(what) {
  case 0:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 3 + L'\a';
    }
    if (borg.temp.fast) {
      return 0;
    }
    _Var3 = borg_spell_okay_fail(HASTE_SELF,wVar4);
    if (!_Var3) {
      return 0;
    }
    wVar5 = borg_get_spell_power(HASTE_SELF);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar5) {
      return 0;
    }
    iVar10 = 5;
    if (borg_simulate != false) {
      return 5;
    }
    bVar2 = HASTE_SELF;
    goto LAB_00204dec;
  case 1:
    if (borg.temp.prot_from_evil) {
      return 0;
    }
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    _Var3 = borg_spell_okay_fail(PROTECTION_FROM_EVIL,wVar4);
    if (!_Var3) {
      return 0;
    }
    wVar5 = borg_get_spell_power(PROTECTION_FROM_EVIL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar5) {
      return 0;
    }
    iVar10 = 3;
    if (borg_simulate != false) {
      return 3;
    }
    bVar2 = PROTECTION_FROM_EVIL;
LAB_00204dec:
    _Var3 = borg_spell_fail(bVar2,wVar4);
    iVar8 = iVar7;
    if (_Var3) {
      borg.no_rest_prep = (short)borg.trait[0x23] * 1000;
      iVar8 = iVar10;
    }
    break;
  case 2:
    wVar4 = L'\x19';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x0f';
    }
    iVar8 = iVar7;
    if ((((!borg.temp.bless) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (((_Var3 = borg_spell_okay_fail(BLESS,wVar4), _Var3 &&
         ((wVar4 = borg_get_spell_power(BLESS), borg.trait[0x23] < 0xb ||
          (wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))))) &&
        (iVar8 = 1, borg_simulate == false)))) {
      borg_spell(BLESS);
      borg.no_rest_prep = 10000;
    }
    break;
  case 3:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    auVar11 = psadbw((undefined1  [16])0x0,ZEXT416((uint)borg.temp._4_4_));
    if (2 < auVar11[0]) {
      return 0;
    }
    _Var3 = borg_spell_okay_fail(RESISTANCE,wVar4);
    if (!_Var3) {
      return 0;
    }
    wVar5 = borg_get_spell_power(RESISTANCE);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar5) {
      return 0;
    }
    if (borg_simulate != false) {
      return 2;
    }
    borg_spell_fail(RESISTANCE,wVar4);
    goto LAB_00204c9c;
  case 4:
    if (2 < (byte)(borg.temp.res_acid + borg.temp.res_fire + borg.temp.res_pois + borg.temp.res_elec
                  + borg.temp.res_cold)) {
      return 0;
    }
    if (borg_fighting_unique == L'\0') {
      return 0;
    }
    _Var3 = borg_equips_item(act_resist_all,true);
    if ((!_Var3) && (_Var3 = borg_equips_item(act_rage_bless_resist,true), !_Var3)) {
      return 0;
    }
    if (borg_simulate != false) {
      return 2;
    }
    _Var3 = borg_activate_item(act_resist_all);
    if ((!_Var3) && (_Var3 = borg_activate_item(act_rage_bless_resist), !_Var3)) {
      return 2;
    }
LAB_00204c9c:
    borg.no_rest_prep = 21000;
    iVar8 = 2;
    break;
  case 5:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    iVar8 = iVar7;
    if (((unique_on_level != 0 && !borg.temp.res_pois) &&
        (_Var3 = borg_spell_okay_fail(RESIST_POISON,wVar4), _Var3)) &&
       ((wVar5 = borg_get_spell_power(RESIST_POISON), wVar5 < borg.trait[0x1e] / 0x14 &&
        ((iVar8 = 1, borg_simulate == false &&
         (_Var3 = borg_spell_fail(RESIST_POISON,wVar4), iVar8 = iVar7, _Var3)))))) {
      borg.no_rest_prep = 21000;
      iVar8 = 1;
    }
    break;
  case 6:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.fastcast) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    _Var3 = borg_spell_okay_fail(MANA_CHANNEL,wVar4);
    if (!_Var3) {
      return 0;
    }
    wVar4 = borg_get_spell_power(MANA_CHANNEL);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar4) {
      return 0;
    }
    if (borg_simulate != false) {
      return 5;
    }
    bVar2 = MANA_CHANNEL;
    goto LAB_002050ab;
  case 7:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    iVar8 = iVar7;
    if (((!borg.temp.hero) && (borg.trait[0x70] == 0)) &&
       ((borg.trait[0x72] == 0 &&
        ((((wVar5 = borg.trait[0x23], wVar6 = borg_heroism_level(), wVar6 < wVar5 &&
           (_Var3 = borg_spell_okay_fail(HEROISM,wVar4), _Var3)) &&
          (wVar4 = borg_get_spell_power(HEROISM),
          wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))) &&
         ((iVar8 = 1, borg_simulate == false && (_Var3 = borg_spell(HEROISM), iVar8 = iVar7, _Var3))
         )))))) {
      borg.no_rest_prep = 3000;
      iVar8 = 1;
    }
    break;
  case 8:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    iVar8 = iVar7;
    if ((((!borg.temp.berserk) && (borg.trait[0x70] == 0)) && (borg.trait[0x72] == 0)) &&
       (((_Var3 = borg_spell_okay_fail(BERSERK_STRENGTH,wVar4), _Var3 &&
         (wVar4 = borg_get_spell_power(BERSERK_STRENGTH),
         wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))) &&
        ((iVar8 = 2, borg_simulate == false &&
         (_Var3 = borg_spell(BERSERK_STRENGTH), iVar8 = iVar7, _Var3)))))) {
      borg.no_rest_prep = 11000;
      iVar8 = 2;
    }
    break;
  case 9:
    iVar8 = iVar7;
    if (((borg_fighting_unique != L'\0') && (!borg.temp.hero)) &&
       ((!borg.temp.berserk &&
        (wVar4 = borg_slot(L'\x1a',sv_potion_berserk), wVar4 != L'\xffffffff')))) {
      if (borg_simulate == false) {
        _Var3 = borg_quaff_potion(sv_potion_berserk);
        iVar8 = (uint)_Var3 * 2;
      }
      else {
        iVar8 = 2;
      }
    }
    break;
  case 10:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    iVar8 = iVar7;
    if ((((!borg.temp.smite_evil) && (borg.trait[0xc2] == 0)) &&
        ((borg.trait[0x70] == 0 &&
         (((borg.trait[0x72] == 0 && (_Var3 = borg_spell_okay_fail(SMITE_EVIL,wVar4), _Var3)) &&
          (wVar4 = borg_get_spell_power(SMITE_EVIL),
          wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))))))) &&
       ((iVar8 = 3, borg_simulate == false && (_Var3 = borg_spell(SMITE_EVIL), iVar8 = iVar7, _Var3)
        ))) {
      borg.no_rest_prep = 21000;
      iVar8 = 3;
    }
    break;
  case 0xb:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    iVar8 = iVar7;
    if (((!borg.temp.venom) && (borg.trait[0xd1] == 0)) &&
       ((borg.trait[0x70] == 0 &&
        ((((borg.trait[0x72] == 0 && (_Var3 = borg_spell_okay_fail(VENOM,wVar4), _Var3)) &&
          (wVar4 = borg_get_spell_power(SMITE_EVIL),
          wVar4 < borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7))) &&
         ((iVar8 = 3, borg_simulate == false && (_Var3 = borg_spell(VENOM), iVar8 = iVar7, _Var3))))
        )))) {
      borg.no_rest_prep = 19000;
      iVar8 = 3;
    }
    break;
  case 0xc:
    wVar4 = L'\x0f';
    if (borg_fighting_unique == L'\0') {
      wVar4 = (uint)(unique_on_level != 0) * 5 + L'\x05';
    }
    if (borg.temp.regen) {
      return 0;
    }
    if (borg.trait[0x70] != 0) {
      return 0;
    }
    if (borg.trait[0x72] != 0) {
      return 0;
    }
    if (borg.trait[0x79] != 0) {
      return 0;
    }
    if (borg.trait[0x1c] < 100) {
      return 0;
    }
    _Var3 = borg_spell_okay_fail(RAPID_REGENERATION,wVar4);
    if (!_Var3) {
      return 0;
    }
    wVar4 = borg_get_spell_power(RAPID_REGENERATION);
    if (borg.trait[0x1e] / (int)((uint)(unique_on_level == 0) * 3 + 7) <= wVar4) {
      return 0;
    }
    bVar2 = RAPID_REGENERATION;
LAB_002050ab:
    _Var3 = borg_spell(bVar2);
    iVar8 = iVar7;
    if (_Var3) {
      borg.no_rest_prep = 6000;
      iVar8 = 1;
    }
    break;
  case 0xe:
    iVar8 = iVar7;
    if ((((borg.trait[0x70] == 0) && (borg.trait[0x72] == 0)) && (borg.trait[0x33] == 0)) &&
       (borg.see_inv == 0)) {
      pbVar1 = borg_grids[borg.c.y];
      lVar9 = (long)borg.c.x;
      _Var3 = borg_spell_okay_fail(SENSE_INVISIBLE,L'\x19');
      if ((((_Var3) && (((pbVar1[lVar9].info & 2) != 0 || (borg.trait[0x1a] != 0)))) &&
          (iVar8 = 10, borg_simulate == false)) &&
         (_Var3 = borg_spell_fail(SENSE_INVISIBLE,L'\x19'), iVar8 = iVar7, _Var3)) {
        borg.see_inv = 32000;
        borg.no_rest_prep = 16000;
        iVar8 = 10;
      }
    }
  }
  return iVar8;
}

Assistant:

static int borg_perma_aux(int what)
{

    /* Analyze */
    switch (what) {
    case BP_SPEED: {
        return (borg_perma_aux_speed());
    }

    case BP_PROT_FROM_EVIL: {
        return (borg_perma_aux_prot_evil());
    }
    case BP_RESIST_ALL: {
        return (borg_perma_aux_resist());
    }
    case BP_RESIST_ALL_COLLUIN: {
        return (borg_perma_aux_resist_colluin());
    }
    case BP_RESIST_P: {
        return (borg_perma_aux_resist_p());
    }
    case BP_BLESS: {
        return (borg_perma_aux_bless());
    }
    case BP_FASTCAST: {
        return (borg_perma_aux_fastcast());
    }
    case BP_HERO: {
        return (borg_perma_aux_hero());
    }
    case BP_BERSERK: {
        return (borg_perma_aux_berserk());
    }
    case BP_BERSERK_POTION: {
        return (borg_perma_aux_berserk_potion());
    }
    case BP_SMITE_EVIL: {
        return (borg_perma_aux_smite_evil());
    }
    case BP_VENOM: {
        return (borg_perma_aux_venom());
    }
    case BP_REGEN: {
        return (borg_perma_aux_regen());
    }
    case BP_GLYPH: {
        /* return (borg_perma_aux_glyph()); Tends to use too much mana doing
         * this */
        return 0;
    }
    case BP_SEE_INV: {
        return (borg_perma_aux_see_inv());
    }
    }
    return 0;
}